

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_number_being_reused_Test
::
~SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_number_being_reused_Test
          (SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_number_being_reused_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_number_being_reused)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    std::optional<SubscriptionSync> message1 = subject_register.NextSubscriptionSync();

    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    std::optional<SubscriptionSync> message2 = subject_register.NextSubscriptionSync();
    EXPECT_EQ(message1->GetEdition(), message2->GetEdition());
}